

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyBlockElimination.cc
# Opt level: O0

bool flow::transform::emptyBlockElimination(IRHandler *handler)

{
  BrInstr *pBVar1;
  bool bVar2;
  size_t sVar3;
  TerminateInstr *pTVar4;
  BasicBlock *pBVar5;
  BasicBlock *pBVar6;
  vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *this;
  reference ppBVar7;
  Instr *this_00;
  reference ppBVar8;
  IRHandler *this_01;
  size_type sVar9;
  BrInstr *local_100;
  BasicBlock *bb_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *__range2_1;
  BasicBlock *pred;
  iterator __end5;
  iterator __begin5;
  vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *__range5;
  BasicBlock *newSuccessor;
  BrInstr *br;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  local_40;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *local_30;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *__range2;
  list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> eliminated;
  IRHandler *handler_local;
  
  eliminated.super__List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>._M_impl.
  _M_node._M_size = (size_t)handler;
  std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::list
            ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2);
  local_40 = IRHandler::basicBlocks_abi_cxx11_
                       ((IRHandler *)
                        eliminated.
                        super__List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                        _M_impl._M_node._M_size);
  local_30 = &local_40;
  __end2 = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::begin(local_30);
  bb = (BasicBlock *)
       util::
       UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
       ::end(local_30);
  do {
    bVar2 = util::
            UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
            ::iterator::operator!=(&__end2,(iterator *)&bb);
    if (!bVar2) {
LAB_001d1cd0:
      __end2_1 = std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::begin
                           ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)
                            &__range2);
      bb_1 = (BasicBlock *)
             std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::end
                       ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2);
      while( true ) {
        bVar2 = std::operator!=(&__end2_1,(_Self *)&bb_1);
        if (!bVar2) break;
        ppBVar8 = std::_List_iterator<flow::BasicBlock_*>::operator*(&__end2_1);
        pBVar5 = *ppBVar8;
        this_01 = BasicBlock::getHandler(pBVar5);
        IRHandler::erase(this_01,pBVar5);
        std::_List_iterator<flow::BasicBlock_*>::operator++(&__end2_1);
      }
      sVar9 = std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::size
                        ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2)
      ;
      std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::~list
                ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2);
      return sVar9 != 0;
    }
    br = (BrInstr *)
         util::
         UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
         ::iterator::operator*(&__end2);
    sVar3 = BasicBlock::size((BasicBlock *)br);
    if (sVar3 == 1) {
      pTVar4 = BasicBlock::getTerminator((BasicBlock *)br);
      if (pTVar4 == (TerminateInstr *)0x0) {
        local_100 = (BrInstr *)0x0;
      }
      else {
        local_100 = (BrInstr *)__dynamic_cast(pTVar4,&TerminateInstr::typeinfo,&BrInstr::typeinfo,0)
        ;
      }
      if (local_100 != (BrInstr *)0x0) {
        pBVar5 = BrInstr::targetBlock(local_100);
        std::__cxx11::list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::push_back
                  ((list<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)&__range2,
                   (value_type *)&br);
        pBVar1 = br;
        pBVar6 = IRHandler::getEntryBlock
                           ((IRHandler *)
                            eliminated.
                            super__List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>
                            ._M_impl._M_node._M_size);
        if ((BasicBlock *)pBVar1 == pBVar6) {
          IRHandler::setEntryBlock
                    ((IRHandler *)
                     eliminated.
                     super__List_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                     _M_impl._M_node._M_size,(BasicBlock *)br);
          goto LAB_001d1cd0;
        }
        this = BasicBlock::predecessors((BasicBlock *)br);
        __end5 = std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::begin(this);
        pred = (BasicBlock *)
               std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::end(this);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end5,(__normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
                                      *)&pred);
          if (!bVar2) break;
          ppBVar7 = __gnu_cxx::
                    __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
                    ::operator*(&__end5);
          this_00 = &BasicBlock::getTerminator(*ppBVar7)->super_Instr;
          Instr::replaceOperand(this_00,(Value *)br,&pBVar5->super_Value);
          __gnu_cxx::
          __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
          ::operator++(&__end5);
        }
      }
    }
    util::
    UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
    ::iterator::operator++(&__end2);
  } while( true );
}

Assistant:

bool emptyBlockElimination(IRHandler* handler) {
  std::list<BasicBlock*> eliminated;

  for (BasicBlock* bb : handler->basicBlocks()) {
    if (bb->size() != 1)
      continue;

    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      BasicBlock* newSuccessor = br->targetBlock();
      eliminated.push_back(bb);
      if (bb == handler->getEntryBlock()) {
        handler->setEntryBlock(bb);
        break;
      } else {
        for (BasicBlock* pred : bb->predecessors()) {
          pred->getTerminator()->replaceOperand(bb, newSuccessor);
        }
      }
    }
  }

  for (BasicBlock* bb : eliminated) {
    bb->getHandler()->erase(bb);
  }

  return eliminated.size() > 0;
}